

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

tc_toktyp_t CTcTokenizer::tokenize_string(utf8_ptr *p,CTcToken *tok,tok_embed_ctx *ec,int expanding)

{
  char *pcVar1;
  tok_embed_level *ptVar2;
  char *buf;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  char *pcVar6;
  tc_toktyp_t tVar7;
  char *pcVar8;
  int triple;
  wchar_t qu;
  bool bVar9;
  tc_toktyp_t local_5c;
  
  pcVar1 = p->p_;
  wVar3 = utf8_ptr::getch(p);
  if (wVar3 == L'R') {
    utf8_ptr::inc(p);
  }
  wVar4 = utf8_ptr::getch(p);
  utf8_ptr::inc(p);
  triple = 0;
  if (((wVar4 == L'\'') || (wVar4 == L'\"')) && (iVar5 = count_quotes(p,wVar4), 1 < iVar5)) {
    utf8_ptr::inc(p);
    utf8_ptr::inc(p);
    triple = 1;
  }
  qu = L'\"';
  if (wVar4 == L'\"') {
    tVar7 = TOKT_DSTR;
  }
  else {
    if (wVar4 == L'>') {
      bVar9 = ec != (tok_embed_ctx *)0x0;
      if (ec == (tok_embed_ctx *)0x0) {
        tVar7 = TOKT_INVALID;
      }
      else {
        if (ec->level == 0) {
          qu = L'\0';
          tVar7 = TOKT_INVALID;
          triple = 0;
        }
        else {
          ptVar2 = ec->s;
          tVar7 = ptVar2->endtok;
          qu = ptVar2->qu;
          triple = ptVar2->triple;
        }
        tok_embed_ctx::end_expr(ec);
      }
      utf8_ptr::inc(p);
      goto LAB_00249ad8;
    }
    bVar9 = false;
    if (wVar4 != L'\'') {
      tVar7 = TOKT_INVALID;
      goto LAB_00249ad8;
    }
    qu = L'\'';
    tVar7 = TOKT_SSTR;
  }
  bVar9 = ec != (tok_embed_ctx *)0x0;
LAB_00249ad8:
  local_5c = TOKT_RESTR;
  if (wVar3 != L'R') {
    local_5c = tVar7;
  }
  buf = p->p_;
LAB_00249af5:
  while (wVar4 = utf8_ptr::getch(p), wVar4 == L'\\') {
    utf8_ptr::inc(p);
    if ((triple == 0) || (wVar4 = utf8_ptr::getch(p), wVar4 != qu)) goto LAB_00249b8c;
    while (wVar4 = utf8_ptr::getch(p), wVar4 == qu) {
      utf8_ptr::inc(p);
    }
  }
  if ((wVar3 == L'R') || (!(bool)(wVar4 == L'<' & bVar9))) {
    if (wVar4 != qu) {
      if (wVar4 == L'\0') {
        pcVar6 = p->p_;
        pcVar8 = pcVar6;
        if ((undefined1  [3440])((undefined1  [3440])*G_tok & (undefined1  [3440])0x20) !=
            (undefined1  [3440])0x0) {
          log_error(0x272a);
LAB_00249c87:
          pcVar8 = p->p_;
        }
        tok->text_ = pcVar1;
        tok->text_len_ = (long)pcVar8 - (long)pcVar1;
        if ((((undefined1  [3440])((undefined1  [3440])*G_tok & (undefined1  [3440])0x20) ==
              (undefined1  [3440])0x0) && (G_tok->string_fp_ != (CVmDataSource *)0x0)) &&
           (buf != pcVar6)) {
          CCharmapToLocal::write_file
                    (G_tok->string_fp_map_,G_tok->string_fp_,buf,(long)pcVar6 - (long)buf);
          (*G_tok->string_fp_->_vptr_CVmDataSource[4])(G_tok->string_fp_,"\n",1);
        }
        tok->typ_ = local_5c;
        return local_5c;
      }
LAB_00249b8c:
      utf8_ptr::inc(p);
      goto LAB_00249af5;
    }
  }
  else {
    wVar4 = utf8_ptr::getch_at(p,1);
    if (wVar4 == L'<') {
      if (tVar7 == TOKT_SSTR) {
        local_5c = TOKT_SSTR_START;
      }
      else if (tVar7 == TOKT_DSTR) {
        local_5c = TOKT_DSTR_START;
      }
      else if (tVar7 == TOKT_DSTR_END) {
        local_5c = TOKT_DSTR_MID;
      }
      else {
        local_5c = TOKT_SSTR_MID;
        if (tVar7 != TOKT_SSTR_END) {
          local_5c = tVar7;
        }
      }
      tok_embed_ctx::start_expr(ec,qu,triple,(uint)(expanding == 0));
      pcVar6 = p->p_;
      utf8_ptr::inc(p);
      utf8_ptr::inc(p);
      goto LAB_00249c87;
    }
    if (qu != L'<') goto LAB_00249b8c;
  }
  if (triple == 0) {
    pcVar6 = p->p_;
    utf8_ptr::inc(p);
    goto LAB_00249c87;
  }
  iVar5 = count_quotes(p,qu);
  if (2 < iVar5) {
    utf8_ptr::inc_by(p,(ulong)(iVar5 - 3));
    pcVar6 = p->p_;
    utf8_ptr::inc_by(p,3);
    goto LAB_00249c87;
  }
  utf8_ptr::inc_by(p,(long)iVar5);
  goto LAB_00249af5;
}

Assistant:

tc_toktyp_t CTcTokenizer::tokenize_string(
    utf8_ptr *p, CTcToken *tok, tok_embed_ctx *ec, int expanding)
{
    /* remember where the text starts */
    const char *start = p->getptr();

    /* check for a regex string - R'...' or R"..." */
    int regex = (p->getch() == 'R');
    if (regex)
        p->inc();

    /* note the quote type, for matching later */
    wchar_t qu = p->getch();

    /* skip the quote in the input */
    p->inc();

    /* check for triple quotes */
    int triple = FALSE;
    if ((qu == '"' || qu == '\'') && count_quotes(p, qu) >= 2)
    {
        /* note the triple quotes */
        triple = TRUE;

        /* skip the open quotes */
        p->inc();
        p->inc();
    }

    /* determine the token type based on the quote type */
    tc_toktyp_t typ;
    int allow_embedding;
    switch(qu)
    {
    case '\'':
        /* single-quoted string */
        typ = TOKT_SSTR;
        allow_embedding = (ec != 0);
        break;

    case '"':
        /* regular double-quoted string */
        typ = TOKT_DSTR;
        allow_embedding = (ec != 0);
        break;

    case '>':
        /* get the ending type for the embedding */
        if (ec != 0)
        {
            /* return to the enclosing string context */
            typ = ec->endtok();
            qu = ec->qu();
            triple = ec->triple();

            /* allow more embeddings */
            allow_embedding = TRUE;

            /* exit the expression context */
            ec->end_expr();
        }
        else
        {
            /* we can only finish an embedding if we were already in one */
            typ = TOKT_INVALID;
            qu = '"';
            allow_embedding = FALSE;
        }

        /* skip the extra '>' character */
        p->inc();
        break;

    default:
        /* anything else is invalid */
        typ = TOKT_INVALID;
        qu = '"';
        allow_embedding = FALSE;
        break;
    }

    /* if it's a regex string, it has special handling */
    if (regex)
    {
        /* embeddings aren't allowed in regex strings */
        allow_embedding = FALSE;

        /* the token type is 'regex string' */
        typ = TOKT_RESTR;
    }

    /* this is where the string's contents start */
    const char *contents_start = p->getptr();

    /* we don't know where it ends yet */
    const char *contents_end;

    /* scan the string */
    for (;;)
    {
        /* get the current character */
        wchar_t cur = p->getch();

        /* see what we have */
        if (cur == '\\')
        {
            /* escape sequence - skip an extra character */
            p->inc();

            /* 
             *   if we're in a triple-quoted string, and this matches the
             *   quote type, a single '\' escapes all consecutive quotes 
             */
            if (triple && p->getch() == qu)
            {
                /* skip the whole run of quotes */
                for ( ; p->getch() == qu ; p->inc()) ;

                /* take it from the top, as we've already skipped them all */
                continue;
            }
        }
        else if (cur == '<' && allow_embedding && p->getch_at(1) == '<')
        {
            /* 
             *   it's the start of an embedded expression - return the
             *   appropriate embedded string part type 
             */
            typ = (typ == TOKT_DSTR ? TOKT_DSTR_START :
                   typ == TOKT_DSTR_END ? TOKT_DSTR_MID :
                   typ == TOKT_SSTR ? TOKT_SSTR_START :
                   typ == TOKT_SSTR_END ? TOKT_SSTR_MID :
                   typ);

            /* remember that we're in an embedding in the token stream */
            ec->start_expr(qu, triple, !expanding);

            /* this is where the contents end */
            contents_end = p->getptr();

            /* skip the two embedding characters */
            p->inc();
            p->inc();

            /* we're done - set the text in the token */
            tok->set_text(start, p->getptr() - start);

            /* done */
            break;
        }
        else if (cur == qu)
        {
            /* 
             *   if we're in a triple-quoted string, it ends at a triple
             *   quote, except that any additional consecutive quotes go
             *   inside the string rather than outside 
             */
            if (triple)
            {
                /* we need at least three quotes in a row to end the string */
                int qcnt = count_quotes(p, qu);
                if (qcnt >= 3)
                {
                    /* the contents include any quotes before the last 3 */
                    p->inc_by(qcnt - 3);
                    contents_end = p->getptr();

                    /* skip the three close quotes */
                    p->inc_by(3);
                }
                else
                {
                    /* it's not ending; skip the quotes and carry on */
                    p->inc_by(qcnt);
                    continue;
                }
            }
            else
            {
                /* note where the string ends */
                contents_end = p->getptr();

                /* skip the closing quote */
                p->inc();
            }

            /* we're done - set the text in the token */
            tok->set_text(start, p->getptr() - start);
            
            /* done */
            break;
        }
        else if (cur == '\0')
        {
            /* this is where the contents end */
            contents_end = p->getptr();

            /* 
             *   We have an unterminated string.  If we're evaluating a
             *   preprocessor constant expression, log an error; otherwise
             *   let it go for now, since we'll catch the error during the
             *   normal tokenizing pass for parsing. 
             */
            if (G_tok->in_pp_expr_)
                log_error(TCERR_PP_UNTERM_STRING);

            /* set the partial text */
            tok->set_text(start, p->getptr() - start);
            
            /* end of line - return with the string unfinished */
            break;
        }

        /* skip this character of input */
        p->inc();
    }

    /* 
     *   if we're not in preprocessor mode, and we're saving string text,
     *   write the string to the string text output file 
     */
    if (!G_tok->in_pp_expr_ && G_tok->string_fp_ != 0
        && contents_start != contents_end)
    {
        /* write the line, translating back to the source character set */
        G_tok->string_fp_map_
            ->write_file(G_tok->string_fp_, contents_start,
                         (size_t)(contents_end - contents_start));

        /* add a newline */
        G_tok->string_fp_->write("\n", 1);
    }

    /* set the type in the token */
    tok->settyp(typ);

    /* return the token type */
    return tok->gettyp();
}